

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSimBase.c
# Opt level: O0

void Gia_RsbFree(Gia_RsbMan_t *p)

{
  Gia_RsbMan_t *p_local;
  
  Vec_IntFree(p->vActive);
  Vec_IntFree(p->vObjs);
  Vec_IntFree(p->vObjs2);
  Vec_WecFree(p->vSets[0]);
  Vec_WecFree(p->vSets[1]);
  if (p->pSet[0] != (word *)0x0) {
    free(p->pSet[0]);
    p->pSet[0] = (word *)0x0;
  }
  if (p->pSet[1] != (word *)0x0) {
    free(p->pSet[1]);
    p->pSet[1] = (word *)0x0;
  }
  if (p->pSet[2] != (word *)0x0) {
    free(p->pSet[2]);
    p->pSet[2] = (word *)0x0;
  }
  if (p != (Gia_RsbMan_t *)0x0) {
    free(p);
  }
  return;
}

Assistant:

void Gia_RsbFree( Gia_RsbMan_t * p )
{
    Vec_IntFree( p->vActive );
    Vec_IntFree( p->vObjs );
    Vec_IntFree( p->vObjs2 );
    Vec_WecFree( p->vSets[0] );
    Vec_WecFree( p->vSets[1] );
    ABC_FREE( p->pSet[0] );
    ABC_FREE( p->pSet[1] );
    ABC_FREE( p->pSet[2] );
    ABC_FREE( p );
}